

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

string * __thiscall
toml::detail::region::line_num_abi_cxx11_(string *__return_storage_ptr__,region *this)

{
  difference_type dVar1;
  char local_29;
  char *local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  region *local_18;
  region *this_local;
  
  local_18 = this;
  this_local = (region *)__return_storage_ptr__;
  local_20._M_current = (char *)begin(this);
  local_28 = (char *)first(this);
  local_29 = '\n';
  dVar1 = std::
          count<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
                    (local_20,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               )local_28,&local_29);
  std::__cxx11::to_string(__return_storage_ptr__,dVar1 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string line_num() const override
    {
        return std::to_string(1 + std::count(this->begin(), this->first(), '\n'));
    }